

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzDDD::VariablesQbSetSpeed(ChNodeFEAxyzDDD *this,double step)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ChVector<double> local_88;
  ChVectorRef local_70;
  MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_58 [56];
  
  ChNodeFEAxyzDD::VariablesQbSetSpeed(&this->super_ChNodeFEAxyzDD,step);
  auVar3 = *(undefined1 (*) [16])(this->DDD_dt).m_data;
  dVar1 = (this->DDD_dt).m_data[2];
  ChVariables::Get_qb(&local_70,*(ChVariables **)&(this->super_ChNodeFEAxyzDD).field_0x188);
  Eigen::
  VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
  VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
               *)local_58,&local_70,0,3);
  ChVector<double>::
  ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
            (&local_88,local_58,(type *)0x0);
  if (&this->DDD_dt != &local_88) {
    (this->DDD_dt).m_data[0] = local_88.m_data[0];
    (this->DDD_dt).m_data[1] = local_88.m_data[1];
    (this->DDD_dt).m_data[2] = local_88.m_data[2];
  }
  if ((step != 0.0) || (NAN(step))) {
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])(this->DDD_dt).m_data,auVar3);
    dVar4 = 1.0 / step;
    dVar2 = (this->DDD_dt).m_data[2];
    (this->DDD_dtdt).m_data[0] = dVar4 * auVar3._0_8_;
    (this->DDD_dtdt).m_data[1] = dVar4 * auVar3._8_8_;
    (this->DDD_dtdt).m_data[2] = dVar4 * (dVar2 - dVar1);
  }
  return;
}

Assistant:

void ChNodeFEAxyzDDD::VariablesQbSetSpeed(double step) {
    ChNodeFEAxyzDD::VariablesQbSetSpeed(step);

    ChVector<> oldDDD_dt = DDD_dt;
    SetDDD_dt(variables_DDD->Get_qb().segment(0, 3));
    if (step) {
        SetDDD_dtdt((DDD_dt - oldDDD_dt) / step);
    }
}